

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

Element * __thiscall Rml::Element::GetFocusLeafNode(Element *this)

{
  Element *pEVar1;
  
  for (pEVar1 = this->focus; pEVar1 != (Element *)0x0; pEVar1 = pEVar1->focus) {
    this = pEVar1;
  }
  return this;
}

Assistant:

Element* Element::GetFocusLeafNode()
{
	// If there isn't a focus, then we are the leaf.
	if (!focus)
	{
		return this;
	}

	// Recurse down the tree until we found the leaf focus element
	Element* focus_element = focus;
	while (focus_element->focus)
		focus_element = focus_element->focus;

	return focus_element;
}